

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

void __thiscall QObjectPrivate::~QObjectPrivate(QObjectPrivate *this)

{
  bool bVar1;
  int iVar2;
  Type pQVar3;
  QThread *pQVar4;
  Type pQVar5;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  int in_stack_0000000c;
  QObject *in_stack_00000010;
  TimerId id;
  add_const_t<QList<Qt::TimerId>_> *__range3;
  Type thisThreadData;
  const_iterator __end3;
  const_iterator __begin3;
  char *in_stack_ffffffffffffff68;
  QThreadData *in_stack_ffffffffffffff70;
  ExtraData *this_00;
  char *in_stack_ffffffffffffff78;
  undefined6 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  QMessageLogger local_40;
  TimerId *local_20;
  const_iterator local_18;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = &PTR__QObjectPrivate_00be72e0;
  QBasicAtomicPointer<QThreadData>::loadRelaxed((QBasicAtomicPointer<QThreadData> *)0x3ea832);
  if ((in_RDI[10] != 0) &&
     (bVar1 = QList<Qt::TimerId>::isEmpty((QList<Qt::TimerId> *)0x3ea85c), !bVar1)) {
    pQVar3 = QBasicAtomicPointer<QThread>::loadAcquire((QBasicAtomicPointer<QThread> *)0x3ea872);
    pQVar4 = QThread::currentThread();
    if (pQVar3 == pQVar4) {
      bVar1 = QThreadData::hasEventDispatcher((QThreadData *)0x3ea8aa);
      if (bVar1) {
        pQVar5 = QBasicAtomicPointer<QAbstractEventDispatcher>::loadRelaxed
                           ((QBasicAtomicPointer<QAbstractEventDispatcher> *)0x3ea8c8);
        (*(pQVar5->super_QObject)._vptr_QObject[0x11])(pQVar5,in_RDI[1]);
      }
      local_10.i = (TimerId *)&DAT_aaaaaaaaaaaaaaaa;
      local_10 = QList<Qt::TimerId>::begin((QList<Qt::TimerId> *)in_stack_ffffffffffffff70);
      local_18.i = (TimerId *)&DAT_aaaaaaaaaaaaaaaa;
      local_18 = QList<Qt::TimerId>::end((QList<Qt::TimerId> *)in_stack_ffffffffffffff70);
      while( true ) {
        local_20 = local_18.i;
        bVar1 = QList<Qt::TimerId>::const_iterator::operator!=(&local_10,local_18);
        if (!bVar1) break;
        QList<Qt::TimerId>::const_iterator::operator*(&local_10);
        QAbstractEventDispatcherPrivate::releaseTimerId(Invalid);
        QList<Qt::TimerId>::const_iterator::operator++(&local_10);
      }
    }
    else {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)
                 CONCAT17(in_stack_ffffffffffffff87,
                          CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)),
                 in_stack_ffffffffffffff78,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                 in_stack_ffffffffffffff68);
      QMessageLogger::warning
                (&local_40,"QObject::~QObject: Timers cannot be stopped from another thread");
    }
  }
  iVar2 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x3ea9ef);
  if (iVar2 != 0) {
    QCoreApplication::removePostedEvents(in_stack_00000010,in_stack_0000000c);
  }
  QThreadData::deref(in_stack_ffffffffffffff70);
  if (in_RDI[7] != 0) {
    (**(code **)(*(long *)in_RDI[7] + 0x10))((long *)in_RDI[7],in_RDI[1]);
  }
  this_00 = (ExtraData *)in_RDI[10];
  if (this_00 != (ExtraData *)0x0) {
    ExtraData::~ExtraData(this_00);
    operator_delete(this_00,0x80);
  }
  QObjectData::~QObjectData((QObjectData *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QObjectPrivate::~QObjectPrivate()
{
    auto thisThreadData = threadData.loadRelaxed();
    if (extraData && !extraData->runningTimers.isEmpty()) {
        if (Q_LIKELY(thisThreadData->thread.loadAcquire() == QThread::currentThread())) {
            // unregister pending timers
            if (thisThreadData->hasEventDispatcher())
                thisThreadData->eventDispatcher.loadRelaxed()->unregisterTimers(q_ptr);

            // release the timer ids back to the pool
            for (auto id : std::as_const(extraData->runningTimers))
                QAbstractEventDispatcherPrivate::releaseTimerId(id);
        } else {
            qWarning("QObject::~QObject: Timers cannot be stopped from another thread");
        }
    }

    if (postedEvents.loadRelaxed())
        QCoreApplication::removePostedEvents(q_ptr, 0);

    thisThreadData->deref();

    if (metaObject)
        metaObject->objectDestroyed(q_ptr);

    delete extraData;
}